

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void minja::Value::dump_string(json *primitive,ostringstream *out,char string_quote)

{
  long lVar1;
  ostringstream *poVar2;
  runtime_error *this;
  char cVar3;
  ulong uVar4;
  string_t s;
  string_t local_50;
  
  if ((primitive->m_data).m_type != string) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(&local_50,primitive,-1,' ',false,strict);
    std::operator+(&s,"Value is not a string: ",&local_50);
    std::runtime_error::runtime_error(this,(string *)&s);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(&s,primitive,-1,' ',false,strict);
  if (string_quote != '\"') {
    lVar1 = std::__cxx11::string::find((char)&s,0x27);
    if (lVar1 == -1) {
      std::operator<<((ostream *)out,string_quote);
      for (uVar4 = 1; uVar4 < s._M_string_length - 1; uVar4 = uVar4 + 1) {
        cVar3 = s._M_dataplus._M_p[uVar4];
        if ((cVar3 == '\\') && (s._M_dataplus._M_p[uVar4 + 1] == '\"')) {
          std::operator<<((ostream *)out,'\"');
          uVar4 = uVar4 + 1;
        }
        else {
          poVar2 = out;
          if (cVar3 == string_quote) {
            poVar2 = (ostringstream *)std::operator<<((ostream *)out,'\\');
            cVar3 = string_quote;
          }
          std::operator<<((ostream *)poVar2,cVar3);
        }
      }
      std::operator<<((ostream *)out,string_quote);
      goto LAB_001901ec;
    }
  }
  std::operator<<((ostream *)out,(string *)&s);
LAB_001901ec:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

static void dump_string(const json & primitive, std::ostringstream & out, char string_quote = '\'') {
    if (!primitive.is_string()) throw std::runtime_error("Value is not a string: " + primitive.dump());
    auto s = primitive.dump();
    if (string_quote == '"' || s.find('\'') != std::string::npos) {
      out << s;
      return;
    }
    // Reuse json dump, just changing string quotes
    out << string_quote;
    for (size_t i = 1, n = s.size() - 1; i < n; ++i) {
      if (s[i] == '\\' && s[i + 1] == '"') {
        out << '"';
        i++;
      } else if (s[i] == string_quote) {
        out << '\\' << string_quote;
      } else {
        out << s[i];
      }
    }
    out << string_quote;
  }